

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

deUint32 tcu::packRGB999E5(Vec4 *color)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar10 = color->m_data[0];
  fVar7 = color->m_data[1];
  fVar8 = 65408.0;
  if (fVar10 <= 65408.0) {
    fVar8 = fVar10;
  }
  fVar8 = (float)(-(uint)(0.0 < fVar10) & (uint)fVar8);
  fVar10 = 65408.0;
  if (fVar7 <= 65408.0) {
    fVar10 = fVar7;
  }
  fVar10 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar10);
  fVar7 = color->m_data[2];
  fVar9 = 65408.0;
  if (fVar7 <= 65408.0) {
    fVar9 = fVar7;
  }
  fVar9 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar9);
  fVar7 = (float)(~-(uint)(fVar9 <= fVar10) & (uint)fVar9 | -(uint)(fVar9 <= fVar10) & (uint)fVar10)
  ;
  uVar5 = -(uint)(fVar7 <= fVar8);
  fVar7 = (float)(uVar5 & (uint)fVar8 | ~uVar5 & (uint)fVar7);
  fVar6 = logf(fVar7);
  fVar6 = floorf(fVar6 * 1.442695);
  iVar1 = -0x10;
  if (-0x10 < (int)fVar6) {
    iVar1 = (int)fVar6;
  }
  fVar6 = ldexpf(1.0,iVar1 + -8);
  fVar7 = floorf(fVar7 / fVar6 + 0.5);
  fVar8 = floorf(fVar8 / fVar6 + 0.5);
  uVar5 = (int)fVar8;
  if (0x1fe < (int)fVar8) {
    uVar5 = 0x1ff;
  }
  uVar4 = 0;
  if ((int)uVar5 < 1) {
    uVar5 = uVar4;
  }
  fVar10 = floorf(fVar10 / fVar6 + 0.5);
  uVar3 = (uint)fVar10;
  if (0x1fe < (int)uVar3) {
    uVar3 = 0x1ff;
  }
  if ((int)uVar3 < 1) {
    uVar3 = uVar4;
  }
  fVar10 = floorf(fVar9 / fVar6 + 0.5);
  uVar2 = 0x1ff;
  if ((int)fVar10 < 0x1ff) {
    uVar2 = (int)fVar10;
  }
  if ((int)uVar2 < 1) {
    uVar2 = uVar4;
  }
  return (uVar2 << 0x12 | ((uint)((int)fVar7 == 0x200) + iVar1) * 0x8000000 | uVar3 << 9 | uVar5) +
         0x80000000;
}

Assistant:

deUint32 packRGB999E5 (const tcu::Vec4& color)
{
	const int	mBits	= 9;
	const int	eBits	= 5;
	const int	eBias	= 15;
	const int	eMax	= (1<<eBits)-1;
	const float	maxVal	= (float)(((1<<mBits) - 1) * (1<<(eMax-eBias))) / (float)(1<<mBits);

	float	rc		= deFloatClamp(color[0], 0.0f, maxVal);
	float	gc		= deFloatClamp(color[1], 0.0f, maxVal);
	float	bc		= deFloatClamp(color[2], 0.0f, maxVal);
	float	maxc	= de::max(rc, de::max(gc, bc));
	int		expp	= de::max(-eBias - 1, deFloorFloatToInt32(deFloatLog2(maxc))) + 1 + eBias;
	float	e		= deFloatPow(2.0f, (float)(expp-eBias-mBits));
	int		maxs	= deFloorFloatToInt32(maxc / e + 0.5f);

	deUint32	exps	= maxs == (1<<mBits) ? expp+1 : expp;
	deUint32	rs		= (deUint32)deClamp32(deFloorFloatToInt32(rc / e + 0.5f), 0, (1<<9)-1);
	deUint32	gs		= (deUint32)deClamp32(deFloorFloatToInt32(gc / e + 0.5f), 0, (1<<9)-1);
	deUint32	bs		= (deUint32)deClamp32(deFloorFloatToInt32(bc / e + 0.5f), 0, (1<<9)-1);

	DE_ASSERT((exps & ~((1<<5)-1)) == 0);
	DE_ASSERT((rs & ~((1<<9)-1)) == 0);
	DE_ASSERT((gs & ~((1<<9)-1)) == 0);
	DE_ASSERT((bs & ~((1<<9)-1)) == 0);

	return rs | (gs << 9) | (bs << 18) | (exps << 27);
}